

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

StringView __thiscall
anon_unknown.dwarf_5d835d::ExpandedSpecialSubstitution::getBaseName
          (ExpandedSpecialSubstitution *this)

{
  long lVar1;
  StringView SVar2;
  
  lVar1 = (long)*(int *)&(this->super_Node).field_0xc;
  SVar2.Last = &DAT_001fe678 + *(int *)(&DAT_001fe678 + lVar1 * 4);
  SVar2.First = &DAT_001fe690 + *(int *)(&DAT_001fe690 + lVar1 * 4);
  return SVar2;
}

Assistant:

StringView getBaseName() const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      return StringView("allocator");
    case SpecialSubKind::basic_string:
      return StringView("basic_string");
    case SpecialSubKind::string:
      return StringView("basic_string");
    case SpecialSubKind::istream:
      return StringView("basic_istream");
    case SpecialSubKind::ostream:
      return StringView("basic_ostream");
    case SpecialSubKind::iostream:
      return StringView("basic_iostream");
    }
    LLVM_BUILTIN_UNREACHABLE;
  }